

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool Fossilize::find_extension
               (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *exts,
               char *ext)

{
  bool bVar1;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  local_40;
  char **local_38;
  VkExtensionProperties *local_30;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  local_28;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  local_20;
  __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  itr;
  char *ext_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *exts_local;
  
  itr._M_current = (VkExtensionProperties *)ext;
  local_28._M_current =
       (VkExtensionProperties *)
       std::begin<std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>(exts);
  local_30 = (VkExtensionProperties *)
             std::end<std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>
                       (exts);
  local_38 = (char **)&itr;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<VkExtensionProperties_const*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>,Fossilize::find_extension(std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>const&,char_const*)::__0>
                       (local_28,(__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                  )local_30,(anon_class_8_1_ba1d4581_for__M_pred)local_38);
  local_40._M_current =
       (VkExtensionProperties *)
       std::end<std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>(exts);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  return bVar1;
}

Assistant:

static bool find_extension(const vector<VkExtensionProperties> &exts, const char *ext)
{
	auto itr = find_if(begin(exts), end(exts), [&](const VkExtensionProperties &prop) -> bool {
		return strcmp(ext, prop.extensionName) == 0;
	});
	return itr != end(exts);
}